

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_string_fromCharCode(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValueUnion JVar1;
  int64_t iVar2;
  int iVar3;
  long lVar4;
  JSValue JVar5;
  int32_t c;
  StringBuffer b_s;
  
  b_s.len = 0;
  b_s.is_wide_char = 0;
  b_s.error_status = 0;
  b_s.ctx = ctx;
  b_s.size = argc;
  b_s.str = js_alloc_string(ctx,argc,0);
  if (b_s.str == (JSString *)0x0) {
    b_s.size = 0;
    b_s.error_status = -1;
  }
  if (0 < argc) {
    lVar4 = 0;
    do {
      JVar1 = (JSValueUnion)((JSValueUnion *)((long)&argv->u + lVar4))->ptr;
      iVar2 = *(int64_t *)((long)&argv->tag + lVar4);
      if (0xfffffff4 < (uint)iVar2) {
        *(int *)JVar1.ptr = *JVar1.ptr + 1;
      }
      JVar5.tag = iVar2;
      JVar5.u.ptr = JVar1.ptr;
      iVar3 = JS_ToInt32Free(ctx,&c,JVar5);
      if ((iVar3 != 0) || (iVar3 = string_buffer_putc16(&b_s,(uint)(ushort)c), iVar3 != 0)) {
        (*((b_s.ctx)->rt->mf).js_free)(&(b_s.ctx)->rt->malloc_state,b_s.str);
        return (JSValue)(ZEXT816(6) << 0x40);
      }
      lVar4 = lVar4 + 0x10;
    } while ((ulong)(uint)argc << 4 != lVar4);
  }
  JVar5 = string_buffer_end(&b_s);
  return JVar5;
}

Assistant:

static JSValue js_string_fromCharCode(JSContext *ctx, JSValueConst this_val,
                                      int argc, JSValueConst *argv)
{
    int i;
    StringBuffer b_s, *b = &b_s;

    string_buffer_init(ctx, b, argc);

    for(i = 0; i < argc; i++) {
        int32_t c;
        if (JS_ToInt32(ctx, &c, argv[i]) || string_buffer_putc16(b, c & 0xffff)) {
            string_buffer_free(b);
            return JS_EXCEPTION;
        }
    }
    return string_buffer_end(b);
}